

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void ConvertARGBToUV_SSE2(uint32_t *argb,uint8_t *u,uint8_t *v,int src_width,int do_store)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  undefined8 uVar5;
  short sVar6;
  undefined4 uVar7;
  undefined6 uVar8;
  undefined8 uVar9;
  short sVar10;
  undefined4 uVar11;
  undefined6 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  __m128i *palVar15;
  uint in_ECX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  int in_R8D;
  __m128i prev_v;
  __m128i prev_u;
  __m128i V1;
  __m128i U1;
  __m128i V0;
  __m128i U0;
  __m128i rgb [6];
  int i;
  int max_width;
  undefined8 local_1a8;
  undefined8 uStackY_1a0;
  undefined8 local_198;
  undefined8 uStackY_190;
  char in_stack_fffffffffffffe78;
  char in_stack_fffffffffffffe79;
  char in_stack_fffffffffffffe7a;
  char in_stack_fffffffffffffe7b;
  char in_stack_fffffffffffffe7c;
  char in_stack_fffffffffffffe7d;
  char in_stack_fffffffffffffe7e;
  char in_stack_fffffffffffffe7f;
  char in_stack_fffffffffffffe80;
  char in_stack_fffffffffffffe81;
  char in_stack_fffffffffffffe82;
  char in_stack_fffffffffffffe83;
  char in_stack_fffffffffffffe84;
  char in_stack_fffffffffffffe85;
  char in_stack_fffffffffffffe86;
  char in_stack_fffffffffffffe87;
  char in_stack_fffffffffffffe88;
  char in_stack_fffffffffffffe89;
  char in_stack_fffffffffffffe8a;
  char in_stack_fffffffffffffe8b;
  char in_stack_fffffffffffffe8c;
  char in_stack_fffffffffffffe8d;
  char in_stack_fffffffffffffe8e;
  char in_stack_fffffffffffffe8f;
  char in_stack_fffffffffffffe90;
  char in_stack_fffffffffffffe91;
  char in_stack_fffffffffffffe92;
  char in_stack_fffffffffffffe93;
  char in_stack_fffffffffffffe94;
  char in_stack_fffffffffffffe95;
  char in_stack_fffffffffffffe96;
  char in_stack_fffffffffffffe97;
  longlong local_168 [2];
  longlong alStack_158 [2];
  longlong alStack_148 [2];
  longlong alStack_138 [2];
  longlong alStack_128 [2];
  longlong alStack_118 [3];
  int local_100;
  uint local_fc;
  int local_f8;
  uint local_f4;
  __m128i *local_f0;
  __m128i *local_e8;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  undefined8 local_c8;
  undefined8 uStack_c0;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  undefined8 local_a8;
  undefined8 uStack_a0;
  longlong local_98;
  longlong lStack_90;
  __m128i *local_80;
  __m128i *in_stack_ffffffffffffff88;
  __m128i *in_stack_ffffffffffffff90;
  __m128i *in_stack_ffffffffffffff98;
  __m128i *in_stack_ffffffffffffffa0;
  __m128i *in_stack_ffffffffffffffa8;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 local_28;
  undefined1 uStack_27;
  undefined1 uStack_26;
  undefined1 uStack_25;
  undefined1 uStack_24;
  undefined1 uStack_23;
  undefined1 uStack_22;
  undefined1 uStack_21;
  undefined1 uStack_20;
  undefined1 uStack_1f;
  undefined1 uStack_1e;
  undefined1 uStack_1d;
  undefined1 uStack_1c;
  undefined1 uStack_1b;
  undefined1 uStack_1a;
  undefined1 uStack_19;
  
  local_fc = in_ECX & 0xffffffe0;
  local_f8 = in_R8D;
  local_f4 = in_ECX;
  local_f0 = in_RDX;
  palVar15 = in_RSI;
  for (local_100 = 0; local_e8 = palVar15, local_100 < (int)local_fc; local_100 = local_100 + 0x20)
  {
    RGB32PackedToPlanar_SSE2
              ((uint32_t *)
               CONCAT17(in_stack_fffffffffffffe8f,
                        CONCAT16(in_stack_fffffffffffffe8e,
                                 CONCAT15(in_stack_fffffffffffffe8d,
                                          CONCAT14(in_stack_fffffffffffffe8c,
                                                   CONCAT13(in_stack_fffffffffffffe8b,
                                                            CONCAT12(in_stack_fffffffffffffe8a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffe89,
                                                  in_stack_fffffffffffffe88))))))),
               (__m128i *)
               CONCAT17(in_stack_fffffffffffffe87,
                        CONCAT16(in_stack_fffffffffffffe86,
                                 CONCAT15(in_stack_fffffffffffffe85,
                                          CONCAT14(in_stack_fffffffffffffe84,
                                                   CONCAT13(in_stack_fffffffffffffe83,
                                                            CONCAT12(in_stack_fffffffffffffe82,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffe81,
                                                  in_stack_fffffffffffffe80))))))));
    HorizontalAddPack_SSE2(&local_168,&alStack_158,&local_168);
    HorizontalAddPack_SSE2(&alStack_148,&alStack_138,&alStack_148);
    HorizontalAddPack_SSE2(&alStack_128,(__m128i *)alStack_118,&alStack_128);
    ConvertRGBToUV_SSE2(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff88);
    RGB32PackedToPlanar_SSE2
              ((uint32_t *)
               CONCAT17(in_stack_fffffffffffffe8f,
                        CONCAT16(in_stack_fffffffffffffe8e,
                                 CONCAT15(in_stack_fffffffffffffe8d,
                                          CONCAT14(in_stack_fffffffffffffe8c,
                                                   CONCAT13(in_stack_fffffffffffffe8b,
                                                            CONCAT12(in_stack_fffffffffffffe8a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffe89,
                                                  in_stack_fffffffffffffe88))))))),
               (__m128i *)
               CONCAT17(in_stack_fffffffffffffe87,
                        CONCAT16(in_stack_fffffffffffffe86,
                                 CONCAT15(in_stack_fffffffffffffe85,
                                          CONCAT14(in_stack_fffffffffffffe84,
                                                   CONCAT13(in_stack_fffffffffffffe83,
                                                            CONCAT12(in_stack_fffffffffffffe82,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffe81,
                                                  in_stack_fffffffffffffe80))))))));
    HorizontalAddPack_SSE2(&local_168,&alStack_158,&local_168);
    HorizontalAddPack_SSE2(&alStack_148,&alStack_138,&alStack_148);
    HorizontalAddPack_SSE2(&alStack_128,(__m128i *)alStack_118,&alStack_128);
    ConvertRGBToUV_SSE2(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff88);
    sVar6 = CONCAT11(in_stack_fffffffffffffe89,in_stack_fffffffffffffe88);
    uVar7 = CONCAT13(in_stack_fffffffffffffe8b,CONCAT12(in_stack_fffffffffffffe8a,sVar6));
    uVar8 = CONCAT15(in_stack_fffffffffffffe8d,CONCAT14(in_stack_fffffffffffffe8c,uVar7));
    uVar13 = CONCAT17(in_stack_fffffffffffffe8f,CONCAT16(in_stack_fffffffffffffe8e,uVar8));
    sVar10 = CONCAT11(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90);
    uVar11 = CONCAT13(in_stack_fffffffffffffe93,CONCAT12(in_stack_fffffffffffffe92,sVar10));
    uVar12 = CONCAT15(in_stack_fffffffffffffe95,CONCAT14(in_stack_fffffffffffffe94,uVar11));
    uVar14 = CONCAT17(in_stack_fffffffffffffe97,CONCAT16(in_stack_fffffffffffffe96,uVar12));
    local_a8._2_2_ = (short)((uint)uVar7 >> 0x10);
    local_a8._4_2_ = (short)((uint6)uVar8 >> 0x20);
    local_a8._6_2_ = (short)((ulong)uVar13 >> 0x30);
    uStack_a0._2_2_ = (short)((uint)uVar11 >> 0x10);
    uStack_a0._4_2_ = (short)((uint6)uVar12 >> 0x20);
    uStack_a0._6_2_ = (short)((ulong)uVar14 >> 0x30);
    local_b8 = (short)local_198;
    sStack_b6 = (short)((ulong)local_198 >> 0x10);
    sStack_b4 = (short)((ulong)local_198 >> 0x20);
    sStack_b2 = (short)((ulong)local_198 >> 0x30);
    sStack_b0 = (short)uStackY_190;
    sStack_ae = (short)((ulong)uStackY_190 >> 0x10);
    sStack_ac = (short)((ulong)uStackY_190 >> 0x20);
    sStack_aa = (short)((ulong)uStackY_190 >> 0x30);
    in_stack_fffffffffffffe88 =
         (0 < sVar6) * (sVar6 < 0x100) * in_stack_fffffffffffffe88 - (0xff < sVar6);
    in_stack_fffffffffffffe89 =
         (0 < local_a8._2_2_) * (local_a8._2_2_ < 0x100) * in_stack_fffffffffffffe8a -
         (0xff < local_a8._2_2_);
    in_stack_fffffffffffffe8a =
         (0 < local_a8._4_2_) * (local_a8._4_2_ < 0x100) * in_stack_fffffffffffffe8c -
         (0xff < local_a8._4_2_);
    in_stack_fffffffffffffe8b =
         (0 < local_a8._6_2_) * (local_a8._6_2_ < 0x100) * in_stack_fffffffffffffe8e -
         (0xff < local_a8._6_2_);
    in_stack_fffffffffffffe8c =
         (0 < sVar10) * (sVar10 < 0x100) * in_stack_fffffffffffffe90 - (0xff < sVar10);
    in_stack_fffffffffffffe8d =
         (0 < uStack_a0._2_2_) * (uStack_a0._2_2_ < 0x100) * in_stack_fffffffffffffe92 -
         (0xff < uStack_a0._2_2_);
    in_stack_fffffffffffffe8e =
         (0 < uStack_a0._4_2_) * (uStack_a0._4_2_ < 0x100) * in_stack_fffffffffffffe94 -
         (0xff < uStack_a0._4_2_);
    in_stack_fffffffffffffe8f =
         (0 < uStack_a0._6_2_) * (uStack_a0._6_2_ < 0x100) * in_stack_fffffffffffffe96 -
         (0xff < uStack_a0._6_2_);
    in_stack_fffffffffffffe90 =
         (0 < local_b8) * (local_b8 < 0x100) * (char)local_198 - (0xff < local_b8);
    in_stack_fffffffffffffe91 =
         (0 < sStack_b6) * (sStack_b6 < 0x100) * (char)((ulong)local_198 >> 0x10) -
         (0xff < sStack_b6);
    in_stack_fffffffffffffe92 =
         (0 < sStack_b4) * (sStack_b4 < 0x100) * (char)((ulong)local_198 >> 0x20) -
         (0xff < sStack_b4);
    in_stack_fffffffffffffe93 =
         (0 < sStack_b2) * (sStack_b2 < 0x100) * (char)((ulong)local_198 >> 0x30) -
         (0xff < sStack_b2);
    in_stack_fffffffffffffe94 =
         (0 < sStack_b0) * (sStack_b0 < 0x100) * (char)uStackY_190 - (0xff < sStack_b0);
    in_stack_fffffffffffffe95 =
         (0 < sStack_ae) * (sStack_ae < 0x100) * (char)((ulong)uStackY_190 >> 0x10) -
         (0xff < sStack_ae);
    in_stack_fffffffffffffe96 =
         (0 < sStack_ac) * (sStack_ac < 0x100) * (char)((ulong)uStackY_190 >> 0x20) -
         (0xff < sStack_ac);
    in_stack_fffffffffffffe97 =
         (0 < sStack_aa) * (sStack_aa < 0x100) * (char)((ulong)uStackY_190 >> 0x30) -
         (0xff < sStack_aa);
    sVar6 = CONCAT11(in_stack_fffffffffffffe79,in_stack_fffffffffffffe78);
    uVar7 = CONCAT13(in_stack_fffffffffffffe7b,CONCAT12(in_stack_fffffffffffffe7a,sVar6));
    uVar8 = CONCAT15(in_stack_fffffffffffffe7d,CONCAT14(in_stack_fffffffffffffe7c,uVar7));
    uVar5 = CONCAT17(in_stack_fffffffffffffe7f,CONCAT16(in_stack_fffffffffffffe7e,uVar8));
    sVar10 = CONCAT11(in_stack_fffffffffffffe81,in_stack_fffffffffffffe80);
    uVar11 = CONCAT13(in_stack_fffffffffffffe83,CONCAT12(in_stack_fffffffffffffe82,sVar10));
    uVar12 = CONCAT15(in_stack_fffffffffffffe85,CONCAT14(in_stack_fffffffffffffe84,uVar11));
    uVar9 = CONCAT17(in_stack_fffffffffffffe87,CONCAT16(in_stack_fffffffffffffe86,uVar12));
    local_c8._2_2_ = (short)((uint)uVar7 >> 0x10);
    local_c8._4_2_ = (short)((uint6)uVar8 >> 0x20);
    local_c8._6_2_ = (short)((ulong)uVar5 >> 0x30);
    uStack_c0._2_2_ = (short)((uint)uVar11 >> 0x10);
    uStack_c0._4_2_ = (short)((uint6)uVar12 >> 0x20);
    uStack_c0._6_2_ = (short)((ulong)uVar9 >> 0x30);
    local_d8 = (short)local_1a8;
    sStack_d6 = (short)((ulong)local_1a8 >> 0x10);
    sStack_d4 = (short)((ulong)local_1a8 >> 0x20);
    sStack_d2 = (short)((ulong)local_1a8 >> 0x30);
    sStack_d0 = (short)uStackY_1a0;
    sStack_ce = (short)((ulong)uStackY_1a0 >> 0x10);
    sStack_cc = (short)((ulong)uStackY_1a0 >> 0x20);
    sStack_ca = (short)((ulong)uStackY_1a0 >> 0x30);
    in_stack_fffffffffffffe78 =
         (0 < sVar6) * (sVar6 < 0x100) * in_stack_fffffffffffffe78 - (0xff < sVar6);
    in_stack_fffffffffffffe79 =
         (0 < local_c8._2_2_) * (local_c8._2_2_ < 0x100) * in_stack_fffffffffffffe7a -
         (0xff < local_c8._2_2_);
    in_stack_fffffffffffffe7a =
         (0 < local_c8._4_2_) * (local_c8._4_2_ < 0x100) * in_stack_fffffffffffffe7c -
         (0xff < local_c8._4_2_);
    in_stack_fffffffffffffe7b =
         (0 < local_c8._6_2_) * (local_c8._6_2_ < 0x100) * in_stack_fffffffffffffe7e -
         (0xff < local_c8._6_2_);
    in_stack_fffffffffffffe7c =
         (0 < sVar10) * (sVar10 < 0x100) * in_stack_fffffffffffffe80 - (0xff < sVar10);
    in_stack_fffffffffffffe7d =
         (0 < uStack_c0._2_2_) * (uStack_c0._2_2_ < 0x100) * in_stack_fffffffffffffe82 -
         (0xff < uStack_c0._2_2_);
    in_stack_fffffffffffffe7e =
         (0 < uStack_c0._4_2_) * (uStack_c0._4_2_ < 0x100) * in_stack_fffffffffffffe84 -
         (0xff < uStack_c0._4_2_);
    in_stack_fffffffffffffe7f =
         (0 < uStack_c0._6_2_) * (uStack_c0._6_2_ < 0x100) * in_stack_fffffffffffffe86 -
         (0xff < uStack_c0._6_2_);
    in_stack_fffffffffffffe80 =
         (0 < local_d8) * (local_d8 < 0x100) * (char)local_1a8 - (0xff < local_d8);
    in_stack_fffffffffffffe81 =
         (0 < sStack_d6) * (sStack_d6 < 0x100) * (char)((ulong)local_1a8 >> 0x10) -
         (0xff < sStack_d6);
    in_stack_fffffffffffffe82 =
         (0 < sStack_d4) * (sStack_d4 < 0x100) * (char)((ulong)local_1a8 >> 0x20) -
         (0xff < sStack_d4);
    in_stack_fffffffffffffe83 =
         (0 < sStack_d2) * (sStack_d2 < 0x100) * (char)((ulong)local_1a8 >> 0x30) -
         (0xff < sStack_d2);
    in_stack_fffffffffffffe84 =
         (0 < sStack_d0) * (sStack_d0 < 0x100) * (char)uStackY_1a0 - (0xff < sStack_d0);
    in_stack_fffffffffffffe85 =
         (0 < sStack_ce) * (sStack_ce < 0x100) * (char)((ulong)uStackY_1a0 >> 0x10) -
         (0xff < sStack_ce);
    in_stack_fffffffffffffe86 =
         (0 < sStack_cc) * (sStack_cc < 0x100) * (char)((ulong)uStackY_1a0 >> 0x20) -
         (0xff < sStack_cc);
    in_stack_fffffffffffffe87 =
         (0 < sStack_ca) * (sStack_ca < 0x100) * (char)((ulong)uStackY_1a0 >> 0x30) -
         (0xff < sStack_ca);
    if (local_f8 == 0) {
      lVar1 = (*local_e8)[0];
      lVar2 = (*local_e8)[1];
      lVar3 = (*local_f0)[0];
      lVar4 = (*local_f0)[1];
      local_28 = (undefined1)lVar1;
      uStack_27 = (undefined1)((ulong)lVar1 >> 8);
      uStack_26 = (undefined1)((ulong)lVar1 >> 0x10);
      uStack_25 = (undefined1)((ulong)lVar1 >> 0x18);
      uStack_24 = (undefined1)((ulong)lVar1 >> 0x20);
      uStack_23 = (undefined1)((ulong)lVar1 >> 0x28);
      uStack_22 = (undefined1)((ulong)lVar1 >> 0x30);
      uStack_21 = (undefined1)((ulong)lVar1 >> 0x38);
      uStack_20 = (undefined1)lVar2;
      uStack_1f = (undefined1)((ulong)lVar2 >> 8);
      uStack_1e = (undefined1)((ulong)lVar2 >> 0x10);
      uStack_1d = (undefined1)((ulong)lVar2 >> 0x18);
      uStack_1c = (undefined1)((ulong)lVar2 >> 0x20);
      uStack_1b = (undefined1)((ulong)lVar2 >> 0x28);
      uStack_1a = (undefined1)((ulong)lVar2 >> 0x30);
      uStack_19 = (undefined1)((ulong)lVar2 >> 0x38);
      in_stack_fffffffffffffe88 = pavgb(in_stack_fffffffffffffe88,local_28);
      in_stack_fffffffffffffe89 = pavgb(in_stack_fffffffffffffe89,uStack_27);
      in_stack_fffffffffffffe8a = pavgb(in_stack_fffffffffffffe8a,uStack_26);
      in_stack_fffffffffffffe8b = pavgb(in_stack_fffffffffffffe8b,uStack_25);
      in_stack_fffffffffffffe8c = pavgb(in_stack_fffffffffffffe8c,uStack_24);
      in_stack_fffffffffffffe8d = pavgb(in_stack_fffffffffffffe8d,uStack_23);
      in_stack_fffffffffffffe8e = pavgb(in_stack_fffffffffffffe8e,uStack_22);
      in_stack_fffffffffffffe8f = pavgb(in_stack_fffffffffffffe8f,uStack_21);
      in_stack_fffffffffffffe90 = pavgb(in_stack_fffffffffffffe90,uStack_20);
      in_stack_fffffffffffffe91 = pavgb(in_stack_fffffffffffffe91,uStack_1f);
      in_stack_fffffffffffffe92 = pavgb(in_stack_fffffffffffffe92,uStack_1e);
      in_stack_fffffffffffffe93 = pavgb(in_stack_fffffffffffffe93,uStack_1d);
      in_stack_fffffffffffffe94 = pavgb(in_stack_fffffffffffffe94,uStack_1c);
      in_stack_fffffffffffffe95 = pavgb(in_stack_fffffffffffffe95,uStack_1b);
      in_stack_fffffffffffffe96 = pavgb(in_stack_fffffffffffffe96,uStack_1a);
      in_stack_fffffffffffffe97 = pavgb(in_stack_fffffffffffffe97,uStack_19);
      local_48 = (undefined1)lVar3;
      uStack_47 = (undefined1)((ulong)lVar3 >> 8);
      uStack_46 = (undefined1)((ulong)lVar3 >> 0x10);
      uStack_45 = (undefined1)((ulong)lVar3 >> 0x18);
      uStack_44 = (undefined1)((ulong)lVar3 >> 0x20);
      uStack_43 = (undefined1)((ulong)lVar3 >> 0x28);
      uStack_42 = (undefined1)((ulong)lVar3 >> 0x30);
      uStack_41 = (undefined1)((ulong)lVar3 >> 0x38);
      uStack_40 = (undefined1)lVar4;
      uStack_3f = (undefined1)((ulong)lVar4 >> 8);
      uStack_3e = (undefined1)((ulong)lVar4 >> 0x10);
      uStack_3d = (undefined1)((ulong)lVar4 >> 0x18);
      uStack_3c = (undefined1)((ulong)lVar4 >> 0x20);
      uStack_3b = (undefined1)((ulong)lVar4 >> 0x28);
      uStack_3a = (undefined1)((ulong)lVar4 >> 0x30);
      uStack_39 = (undefined1)((ulong)lVar4 >> 0x38);
      in_stack_fffffffffffffe78 = pavgb(in_stack_fffffffffffffe78,local_48);
      in_stack_fffffffffffffe79 = pavgb(in_stack_fffffffffffffe79,uStack_47);
      in_stack_fffffffffffffe7a = pavgb(in_stack_fffffffffffffe7a,uStack_46);
      in_stack_fffffffffffffe7b = pavgb(in_stack_fffffffffffffe7b,uStack_45);
      in_stack_fffffffffffffe7c = pavgb(in_stack_fffffffffffffe7c,uStack_44);
      in_stack_fffffffffffffe7d = pavgb(in_stack_fffffffffffffe7d,uStack_43);
      in_stack_fffffffffffffe7e = pavgb(in_stack_fffffffffffffe7e,uStack_42);
      in_stack_fffffffffffffe7f = pavgb(in_stack_fffffffffffffe7f,uStack_41);
      in_stack_fffffffffffffe80 = pavgb(in_stack_fffffffffffffe80,uStack_40);
      in_stack_fffffffffffffe81 = pavgb(in_stack_fffffffffffffe81,uStack_3f);
      in_stack_fffffffffffffe82 = pavgb(in_stack_fffffffffffffe82,uStack_3e);
      in_stack_fffffffffffffe83 = pavgb(in_stack_fffffffffffffe83,uStack_3d);
      in_stack_fffffffffffffe84 = pavgb(in_stack_fffffffffffffe84,uStack_3c);
      in_stack_fffffffffffffe85 = pavgb(in_stack_fffffffffffffe85,uStack_3b);
      in_stack_fffffffffffffe86 = pavgb(in_stack_fffffffffffffe86,uStack_3a);
      in_stack_fffffffffffffe87 = pavgb(in_stack_fffffffffffffe87,uStack_39);
      in_stack_ffffffffffffffa8 = local_f0;
    }
    in_stack_ffffffffffffff88 =
         (__m128i *)
         CONCAT17(in_stack_fffffffffffffe8f,
                  CONCAT16(in_stack_fffffffffffffe8e,
                           CONCAT15(in_stack_fffffffffffffe8d,
                                    CONCAT14(in_stack_fffffffffffffe8c,
                                             CONCAT13(in_stack_fffffffffffffe8b,
                                                      CONCAT12(in_stack_fffffffffffffe8a,
                                                               CONCAT11(in_stack_fffffffffffffe89,
                                                                        in_stack_fffffffffffffe88)))
                                            ))));
    in_stack_ffffffffffffff90 =
         (__m128i *)
         CONCAT17(in_stack_fffffffffffffe97,
                  CONCAT16(in_stack_fffffffffffffe96,
                           CONCAT15(in_stack_fffffffffffffe95,
                                    CONCAT14(in_stack_fffffffffffffe94,
                                             CONCAT13(in_stack_fffffffffffffe93,
                                                      CONCAT12(in_stack_fffffffffffffe92,
                                                               CONCAT11(in_stack_fffffffffffffe91,
                                                                        in_stack_fffffffffffffe90)))
                                            ))));
    (*local_e8)[0] = (longlong)in_stack_ffffffffffffff88;
    (*local_e8)[1] = (longlong)in_stack_ffffffffffffff90;
    local_80 = local_f0;
    local_98 = CONCAT17(in_stack_fffffffffffffe7f,
                        CONCAT16(in_stack_fffffffffffffe7e,
                                 CONCAT15(in_stack_fffffffffffffe7d,
                                          CONCAT14(in_stack_fffffffffffffe7c,
                                                   CONCAT13(in_stack_fffffffffffffe7b,
                                                            CONCAT12(in_stack_fffffffffffffe7a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffe79,
                                                  in_stack_fffffffffffffe78)))))));
    lStack_90 = CONCAT17(in_stack_fffffffffffffe87,
                         CONCAT16(in_stack_fffffffffffffe86,
                                  CONCAT15(in_stack_fffffffffffffe85,
                                           CONCAT14(in_stack_fffffffffffffe84,
                                                    CONCAT13(in_stack_fffffffffffffe83,
                                                             CONCAT12(in_stack_fffffffffffffe82,
                                                                      CONCAT11(
                                                  in_stack_fffffffffffffe81,
                                                  in_stack_fffffffffffffe80)))))));
    (*local_f0)[0] = local_98;
    (*local_f0)[1] = lStack_90;
    local_f0 = local_f0 + 1;
    palVar15 = local_e8 + 1;
    local_c8 = uVar5;
    uStack_c0 = uVar9;
    local_a8 = uVar13;
    uStack_a0 = uVar14;
    in_stack_ffffffffffffffa0 = local_e8;
  }
  if (local_100 < (int)local_f4) {
    WebPConvertARGBToUV_C
              ((uint32_t *)
               CONCAT17(in_stack_fffffffffffffe97,
                        CONCAT16(in_stack_fffffffffffffe96,
                                 CONCAT15(in_stack_fffffffffffffe95,
                                          CONCAT14(in_stack_fffffffffffffe94,
                                                   CONCAT13(in_stack_fffffffffffffe93,
                                                            CONCAT12(in_stack_fffffffffffffe92,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffe91,
                                                  in_stack_fffffffffffffe90))))))),
               (uint8_t *)
               CONCAT17(in_stack_fffffffffffffe8f,
                        CONCAT16(in_stack_fffffffffffffe8e,
                                 CONCAT15(in_stack_fffffffffffffe8d,
                                          CONCAT14(in_stack_fffffffffffffe8c,
                                                   CONCAT13(in_stack_fffffffffffffe8b,
                                                            CONCAT12(in_stack_fffffffffffffe8a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffe89,
                                                  in_stack_fffffffffffffe88))))))),
               (uint8_t *)
               CONCAT17(in_stack_fffffffffffffe87,
                        CONCAT16(in_stack_fffffffffffffe86,
                                 CONCAT15(in_stack_fffffffffffffe85,
                                          CONCAT14(in_stack_fffffffffffffe84,
                                                   CONCAT13(in_stack_fffffffffffffe83,
                                                            CONCAT12(in_stack_fffffffffffffe82,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffe81,
                                                  in_stack_fffffffffffffe80))))))),
               CONCAT13(in_stack_fffffffffffffe7f,
                        CONCAT12(in_stack_fffffffffffffe7e,
                                 CONCAT11(in_stack_fffffffffffffe7d,in_stack_fffffffffffffe7c))),
               CONCAT13(in_stack_fffffffffffffe7b,
                        CONCAT12(in_stack_fffffffffffffe7a,
                                 CONCAT11(in_stack_fffffffffffffe79,in_stack_fffffffffffffe78))));
  }
  return;
}

Assistant:

static void ConvertARGBToUV_SSE2(const uint32_t* argb,
                                 uint8_t* u, uint8_t* v,
                                 int src_width, int do_store) {
  const int max_width = src_width & ~31;
  int i;
  for (i = 0; i < max_width; i += 32, u += 16, v += 16) {
    __m128i rgb[6], U0, V0, U1, V1;
    RGB32PackedToPlanar_SSE2(&argb[i], rgb);
    HorizontalAddPack_SSE2(&rgb[0], &rgb[1], &rgb[0]);
    HorizontalAddPack_SSE2(&rgb[2], &rgb[3], &rgb[2]);
    HorizontalAddPack_SSE2(&rgb[4], &rgb[5], &rgb[4]);
    ConvertRGBToUV_SSE2(&rgb[0], &rgb[2], &rgb[4], &U0, &V0);

    RGB32PackedToPlanar_SSE2(&argb[i + 16], rgb);
    HorizontalAddPack_SSE2(&rgb[0], &rgb[1], &rgb[0]);
    HorizontalAddPack_SSE2(&rgb[2], &rgb[3], &rgb[2]);
    HorizontalAddPack_SSE2(&rgb[4], &rgb[5], &rgb[4]);
    ConvertRGBToUV_SSE2(&rgb[0], &rgb[2], &rgb[4], &U1, &V1);

    U0 = _mm_packus_epi16(U0, U1);
    V0 = _mm_packus_epi16(V0, V1);
    if (!do_store) {
      const __m128i prev_u = LOAD_16(u);
      const __m128i prev_v = LOAD_16(v);
      U0 = _mm_avg_epu8(U0, prev_u);
      V0 = _mm_avg_epu8(V0, prev_v);
    }
    STORE_16(U0, u);
    STORE_16(V0, v);
  }
  if (i < src_width) {  // left-over
    WebPConvertARGBToUV_C(argb + i, u, v, src_width - i, do_store);
  }
}